

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::CloneSet
          (SerializationCloner<Js::StreamWriter> *this,Src src,Dst dst)

{
  bool bVar1;
  uint32 data;
  Engine *this_00;
  void **ppvVar2;
  undefined1 local_38 [8];
  Iterator iter;
  JavascriptSet *set;
  Dst dst_local;
  Src src_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  iter.current.ptr = (MapOrSetDataNode<void_*> *)VarTo<Js::JavascriptSet>(src);
  data = JavascriptSet::Size((JavascriptSet *)iter.current.ptr);
  Write(this,data);
  JavascriptSet::GetIterator((JavascriptSet *)local_38);
  while( true ) {
    bVar1 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)local_38);
    if (!bVar1) break;
    this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
              ::GetEngine(&this->
                           super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                         );
    ppvVar2 = MapOrSetDataList<void_*>::Iterator::Current((Iterator *)local_38);
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
              (this_00,*ppvVar2);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::CloneSet(Src src, Dst dst)
    {
        JavascriptSet* set = VarTo<JavascriptSet>(src);

        Write((int32)(set->Size()));

        JavascriptSet::SetDataList::Iterator iter = set->GetIterator();
        while (iter.Next())
        {
            this->GetEngine()->Clone(iter.Current());
        }
    }